

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_3> __thiscall
tcu::refract<float,3>(tcu *this,Vector<float,_3> *i,Vector<float,_3> *n,float eta)

{
  float fVar1;
  undefined8 extraout_XMM0_Qa;
  float fVar2;
  float fVar3;
  Vector<float,_3> VVar4;
  Vector<float,_3> VVar5;
  Vector<float,_3> local_30;
  tcu local_24 [12];
  undefined8 uVar6;
  float fVar7;
  
  fVar1 = dot<float,3>(n,i);
  fVar3 = 1.0 - eta * eta * (1.0 - fVar1 * fVar1);
  fVar2 = 0.0;
  if (0.0 <= fVar3) {
    operator*((tcu *)&local_30,eta,i);
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    operator*(local_24,eta * fVar1 + fVar3,n);
    VVar4 = operator-(this,&local_30,(Vector<float,_3> *)local_24);
  }
  else {
    Vector<float,_3>::Vector((Vector<float,_3> *)this,0.0);
    VVar4.m_data[2] = fVar2;
    VVar4.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar4.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar5.m_data[0] = VVar4.m_data[0];
  uVar6._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  return (Vector<float,_3>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}